

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parallel_for_each.cpp
# Opt level: O3

container * __thiscall
anon_unknown.dwarf_1695ac::ParallelForEach::run_for_each
          (container *__return_storage_ptr__,ParallelForEach *this,container *src)

{
  container *pcVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  future<void> *this_00;
  pointer pfVar5;
  size_type sVar6;
  int iVar7;
  _State_baseV2 *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Result_base *this_01;
  container *extraout_RAX;
  container *extraout_RAX_00;
  ulong uVar9;
  ulong uVar10;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> futures;
  mutex mut;
  long *local_e0;
  __state_type local_d8;
  container *local_c0;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_b8;
  size_type local_98;
  ulong local_90;
  _func_int **local_88 [2];
  __basic_future<void> local_78;
  container *local_68;
  container *local_60;
  container local_58;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_60 = &local_58;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uStack_40 = 0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_38 = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar10 = (long)src - (long)this >> 2;
  if ((long)uVar10 < 1) {
    return local_60;
  }
  local_c0 = src;
  local_68 = __return_storage_ptr__;
  iVar7 = std::thread::hardware_concurrency();
  uVar9 = (ulong)(iVar7 + (uint)(iVar7 == 0));
  if (uVar10 < uVar9) {
    uVar9 = uVar10;
  }
  local_90 = ((uVar10 + uVar9) - 1) / uVar9;
  if (uVar9 * local_90 < uVar10) {
    pstore::assert_failed
              ("partition_size * num_threads >= num_elements",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/parallel_for_each.hpp"
               ,0x31);
  }
  local_b8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (future<void> *)0x0;
  local_b8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (future<void> *)0x0;
  local_b8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _GLOBAL__N_1::std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::reserve
            (&local_b8,uVar9);
  if ((container *)this != local_c0) {
    local_98 = uVar9;
    do {
      uVar9 = local_90;
      if (uVar10 < local_90) {
        uVar9 = uVar10;
      }
      if (0x7ffffffffffffffe < uVar9) {
        pstore::assert_failed
                  ("distance >= 0 && distance < static_cast<udifference_type> ( std::numeric_limits<difference_type>::max ())"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/parallel_for_each.hpp"
                   ,0x3c);
      }
      local_d8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_d8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      p_Var8->_M_use_count = 1;
      p_Var8->_M_weak_count = 1;
      p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0022a880;
      p_Var8[1]._M_use_count = 0;
      p_Var8[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var8[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var8[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var8[2]._M_use_count = 0;
      p_Var8[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var8[3]._M_use_count = 0;
      p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_0022a8d0;
      this_01 = (_Result_base *)operator_new(0x10);
      *(undefined8 *)this_01 = 0;
      *(undefined8 *)(this_01 + 8) = 0;
      std::__future_base::_Result_base::_Result_base(this_01);
      pcVar1 = (container *)
               ((long)&(((container *)this)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + uVar9 * 4);
      *(undefined ***)this_01 = &PTR__M_destroy_0022ab40;
      p_Var8[4]._vptr__Sp_counted_base = (_func_int **)this_01;
      *(container **)&p_Var8[4]._M_use_count = pcVar1;
      p_Var8[5]._vptr__Sp_counted_base = (_func_int **)this;
      *(container ***)&p_Var8[5]._M_use_count = &local_68;
      local_88[0] = (_func_int **)0x0;
      local_e0 = (long *)operator_new(0x20);
      *local_e0 = (long)&PTR___State_0022a928;
      local_e0[1] = (long)(p_Var8 + 1);
      local_e0[2] = (long)_GLOBAL__N_1::std::__future_base::
                          _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/parallel_for_each.hpp:67:34),___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>,_void>
                          ::_M_run;
      local_e0[3] = 0;
      std::thread::_M_start_thread(local_88,&local_e0,0);
      if (local_e0 != (long *)0x0) {
        (**(code **)(*local_e0 + 8))();
      }
      if (p_Var8[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
        std::terminate();
      }
      p_Var8[3]._vptr__Sp_counted_base = local_88[0];
      local_d8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(p_Var8 + 1);
      local_d8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8;
      _GLOBAL__N_1::std::__basic_future<void>::__basic_future(&local_78,&local_d8);
      sVar6 = local_98;
      if (local_d8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_d8.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_b8,
                 (future<void> *)&local_78);
      if (local_78._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      pfVar5 = local_b8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar10 = uVar10 - uVar9;
      this = (ParallelForEach *)pcVar1;
    } while (pcVar1 != local_c0);
    if ((uVar10 == 0) &&
       (this_00 = local_b8.
                  super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl
                  .super__Vector_impl_data._M_start,
       (ulong)((long)local_b8.
                     super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8.
                     super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4) <= sVar6)) {
      for (; this_00 != pfVar5; this_00 = this_00 + 1) {
        if ((this_00->super___basic_future<void>)._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == (element_type *)0x0) {
          pstore::assert_failed
                    ("f.valid ()",
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/parallel_for_each.hpp"
                     ,0x50);
        }
        _GLOBAL__N_1::std::future<void>::get(this_00);
      }
      _GLOBAL__N_1::std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
                (&local_b8);
      piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar2 == piVar3) {
        return extraout_RAX;
      }
      uVar10 = (long)piVar3 - (long)piVar2 >> 2;
      lVar4 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                (piVar2,piVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                (piVar2,piVar3);
      return extraout_RAX_00;
    }
  }
  pstore::assert_failed
            ("num_elements == 0 && futures.size () <= num_threads",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/parallel_for_each.hpp"
             ,0x4c);
}

Assistant:

auto ParallelForEach::run_for_each (container const & src) -> container {
        std::mutex mut;
        container out;
        pstore::parallel_for_each (std::begin (src), std::end (src), [&out, &mut] (int v) {
            std::lock_guard<std::mutex> _{mut};
            out.emplace_back (v * 2);
        });
        std::sort (std::begin (out), std::end (out), std::less<int> ());
        return out;
    }